

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::TestResult::HasFatalFailure(TestResult *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  TestResult *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = internal::
          CountIf<std::vector<testing::TestPartResult,std::allocator<testing::TestPartResult>>,bool(*)(testing::TestPartResult_const&)>
                    (&this->test_part_results_,TestPartFatallyFailed);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0 < iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool TestResult::HasFatalFailure() const {
  return CountIf(test_part_results_, TestPartFatallyFailed) > 0;
}